

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtils.cpp
# Opt level: O0

EmptyFileCreatorDisposer * ApprovalTests::FileUtils::useEmptyFileCreator(EmptyFileCreator *creator)

{
  EmptyFileCreatorDisposer *in_RDI;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *__x;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_ffffffffffffffc0;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_30;
  
  __x = &local_30;
  ::std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function(in_stack_ffffffffffffffc0,__x);
  EmptyFileCreatorDisposer::EmptyFileCreatorDisposer
            ((EmptyFileCreatorDisposer *)in_stack_ffffffffffffffc0,__x);
  ::std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x238e34);
  return in_RDI;
}

Assistant:

EmptyFileCreatorDisposer FileUtils::useEmptyFileCreator(EmptyFileCreator creator)
    {
        return EmptyFileCreatorDisposer(creator);
    }